

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
NumberTemp::ProcessPropertySymUse
          (NumberTemp *this,SymOpnd *symOpnd,Instr *instr,BackwardPass *backwardPass)

{
  uint dstSymID_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  SymID i;
  undefined4 *puVar5;
  JitArenaAllocator *pJVar6;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *pHVar7;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  Opnd *this_01;
  RegOpnd *pRVar8;
  BVSparse<Memory::JitArenaAllocator> **ppBVar9;
  char16 *pcVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  SymID dstSymID;
  Opnd *dstOpnd;
  bool isTempUse;
  SymID propertySymId;
  TrackAllocData local_60;
  BVSparse<Memory::JitArenaAllocator> **local_38;
  BVSparse<Memory::JitArenaAllocator> **bv;
  PropertySym *propertySym;
  BackwardPass *backwardPass_local;
  Instr *instr_local;
  SymOpnd *symOpnd_local;
  NumberTemp *this_local;
  
  propertySym = (PropertySym *)backwardPass;
  backwardPass_local = (BackwardPass *)instr;
  instr_local = (Instr *)symOpnd;
  symOpnd_local = (SymOpnd *)this;
  bVar2 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x381,"(backwardPass->DoMarkTempNumbersOnTempObjects())",
                       "backwardPass->DoMarkTempNumbersOnTempObjects()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsTempPropertyTransferLoad(this,(Instr *)backwardPass_local,(BackwardPass *)propertySym);
  if (bVar2) {
    bv = (BVSparse<Memory::JitArenaAllocator> **)Sym::AsPropertySym((Sym *)instr_local->m_next);
    BVSparse<Memory::JitArenaAllocator>::Set
              (&this->upwardExposedMarkTempObjectLiveFields,(((PropertySym *)bv)->super_Sym).m_id);
    if (this->upwardExposedMarkTempObjectSymsProperties ==
        (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
      pJVar6 = TempTrackerBase::GetAllocator(&this->super_TempTrackerBase);
      pHVar7 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::New
                         (&pJVar6->super_ArenaAllocator,0x10);
      this->upwardExposedMarkTempObjectSymsProperties = pHVar7;
    }
    local_38 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
               FindOrInsertNew(this->upwardExposedMarkTempObjectSymsProperties,*(int *)&bv[4]->alloc
                              );
    if (*local_38 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar6 = TempTrackerBase::GetAllocator(&this->super_TempTrackerBase);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                 ,0x392);
      pJVar6 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar6,&local_60);
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,pJVar6,0x4e98c0);
      pJVar6 = TempTrackerBase::GetAllocator(&this->super_TempTrackerBase);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,pJVar6);
      *local_38 = this_00;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(*local_38,*(BVIndex *)(bv + 3));
    i = GetRepresentativePropertySymId(this,(PropertySym *)bv,(BackwardPass *)propertySym);
    uVar4 = *(ushort *)((long)&backwardPass_local->currentRegion + 6) >> 1;
    if ((uVar4 & 1) == 0) {
      BVSparse<Memory::JitArenaAllocator>::Set((BVSparse<Memory::JitArenaAllocator> *)this,i);
    }
    else {
      bVar2 = IsInLoop(this);
      if ((bVar2) &&
         (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((BVSparse<Memory::JitArenaAllocator> *)this,i), BVar3 == '\0')) {
        this_01 = IR::Instr::GetDst((Instr *)backwardPass_local);
        bVar2 = IR::Opnd::IsRegOpnd(this_01);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                             ,0x3a2,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pRVar8 = IR::Opnd::AsRegOpnd(this_01);
        dstSymID_00 = (pRVar8->m_sym->super_Sym).m_id;
        TempTrackerBase::AddTransferDependencies
                  (&this->super_TempTrackerBase,*(int *)(bv + 3),dstSymID_00,
                   this->propertyIdsTempTransferDependencies);
        bVar2 = DoTrace((BackwardPass *)propertySym);
        if (bVar2) {
          pcVar10 = GetTraceName();
          bVar2 = BackwardPass::IsPrePass((BackwardPass *)propertySym);
          pcVar12 = L"";
          if (bVar2) {
            pcVar12 = L"Prepass ";
          }
          Output::Print(L"%s: %8s s%d -> PropId:%d: ",pcVar10,pcVar12,(ulong)dstSymID_00,
                        (ulong)*(uint *)(bv + 3));
          ppBVar9 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                              (this->propertyIdsTempTransferDependencies,*(int *)(bv + 3));
          BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar9);
        }
      }
    }
    bVar2 = DoTrace((BackwardPass *)propertySym);
    if (bVar2) {
      pcVar10 = GetTraceName();
      bVar2 = BackwardPass::IsPrePass((BackwardPass *)propertySym);
      pcVar12 = L"";
      if (bVar2) {
        pcVar12 = L"Prepass ";
      }
      pcVar11 = L"Non ";
      if ((uVar4 & 1) != 0) {
        pcVar11 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use (PropId:%d)",pcVar10,pcVar12,pcVar11,
                    (ulong)*(uint *)(bv + 3));
      IR::Instr::DumpSimple((Instr *)backwardPass_local);
    }
  }
  return;
}

Assistant:

void
NumberTemp::ProcessPropertySymUse(IR::SymOpnd * symOpnd, IR::Instr * instr, BackwardPass * backwardPass)
{
    Assert(backwardPass->DoMarkTempNumbersOnTempObjects());

    // We only care about instruction that may transfer the property value
    if (!NumberTemp::IsTempPropertyTransferLoad(instr, backwardPass))
    {
        return;
    }

    PropertySym * propertySym = symOpnd->m_sym->AsPropertySym();
    upwardExposedMarkTempObjectLiveFields.Set(propertySym->m_id);
    if (upwardExposedMarkTempObjectSymsProperties == nullptr)
    {
        upwardExposedMarkTempObjectSymsProperties = HashTable<BVSparse<JitArenaAllocator> *>::New(this->GetAllocator(), 16);
    }
    BVSparse<JitArenaAllocator> ** bv = upwardExposedMarkTempObjectSymsProperties->FindOrInsertNew(propertySym->m_stackSym->m_id);
    if (*bv == nullptr)
    {
        *bv = JitAnew(this->GetAllocator(), BVSparse<JitArenaAllocator>, this->GetAllocator());
    }
    (*bv)->Set(propertySym->m_propertyId);

    SymID propertySymId = this->GetRepresentativePropertySymId(propertySym, backwardPass);
    bool isTempUse = instr->dstIsTempNumber;
    if (!isTempUse)
    {
        // Use of the value is non temp, track the property ID's property representative sym so we don't mark temp
        // assignment to this property on stack objects.
        this->nonTempSyms.Set(propertySymId);
    }
    else if (this->IsInLoop() && !this->nonTempSyms.Test(propertySymId))
    {
        // We didn't already detect non temp use of this property id. so we should track the dependencies in loops
        IR::Opnd * dstOpnd = instr->GetDst();
        Assert(dstOpnd->IsRegOpnd());
        SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;
        AddTransferDependencies(propertySym->m_propertyId, dstSymID, this->propertyIdsTempTransferDependencies);
#if DBG_DUMP
        if (NumberTemp::DoTrace(backwardPass))
        {
            Output::Print(_u("%s: %8s s%d -> PropId:%d: "), NumberTemp::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID, propertySym->m_propertyId);
            (*this->propertyIdsTempTransferDependencies->Get(propertySym->m_propertyId))->Dump();
        }
#endif
    }

#if DBG_DUMP
    if (NumberTemp::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use (PropId:%d)"), NumberTemp::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "), propertySym->m_propertyId);
        instr->DumpSimple();
    }
#endif
}